

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

Status __thiscall
flatbuffers::anon_unknown_10::TsCodeGenerator::GenerateMakeRule
          (TsCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  string local_50;
  string *local_30;
  string *output_local;
  string *filename_local;
  string *path_local;
  Parser *parser_local;
  TsCodeGenerator *this_local;
  
  local_30 = output;
  output_local = filename;
  filename_local = path;
  path_local = (string *)parser;
  parser_local = (Parser *)this;
  TSMakeRule(&local_50,parser,path,filename);
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = TSMakeRule(parser, path, filename);
    return Status::OK;
  }